

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall SQCompilation::CheckerVisitor::visitParamDecl(CheckerVisitor *this,ParamDecl *p)

{
  Expr *pEVar1;
  SymbolInfo *info;
  VarScope *pVVar2;
  FunctionInfo *pFVar3;
  Chunk *pCVar4;
  ValueRef *pVVar5;
  mapped_type *ppVVar6;
  SQChar *local_38;
  
  (*(this->super_Visitor)._vptr_Visitor[0x2a])();
  pEVar1 = (p->super_ValueDecl)._expr;
  pCVar4 = Arena::findChunk(this->arena,0x18);
  info = (SymbolInfo *)pCVar4->_ptr;
  pCVar4->_ptr = (uint8_t *)(info + 1);
  (info->declarator).x = (Id *)0x0;
  info->kind = SK_PARAM;
  info->declared = true;
  info->used = false;
  info->usedAfterAssign = false;
  info->ownedScope = (VarScope *)0x0;
  pVVar5 = makeValueRef(this,info);
  pVVar5->state = VRS_UNKNOWN;
  pVVar5->expression = (Expr *)0x0;
  (info->declarator).p = p;
  pVVar2 = this->currentScope;
  info->ownedScope = pVVar2;
  info->used = p->_isVararg;
  if (((pEVar1 != (Expr *)0x0) && ((pEVar1->super_Node)._op == TO_LITERAL)) &&
     (*(int *)&(pEVar1->super_Node).field_0x1c == 4)) {
    *(byte *)&pVVar5->flagsPositive = (byte)pVVar5->flagsPositive | 2;
  }
  local_38 = (p->super_ValueDecl)._name;
  ppVVar6 = std::__detail::
            _Map_base<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<const_char_*,_std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pVVar2->symbols,&local_38);
  *ppVVar6 = pVVar5;
  if (this->effectsOnly == false) {
    pFVar3 = this->currentInfo;
    local_38 = normalizeParamName(this,(p->super_ValueDecl)._name,(SQChar *)0x0);
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&pFVar3->parameters,&local_38);
  }
  return;
}

Assistant:

void CheckerVisitor::visitParamDecl(ParamDecl *p) {
  Visitor::visitParamDecl(p);

  const Expr *dv = p->defaultValue();

  SymbolInfo *info = makeSymbolInfo(SK_PARAM);
  ValueRef *v = makeValueRef(info);
  v->state = VRS_UNKNOWN;
  v->expression = nullptr;
  info->declarator.p = p;
  info->ownedScope = currentScope;
  info->used = p->isVararg();

  if (dv && dv->op() == TO_LITERAL) {
    if (dv->asLiteral()->kind() == LK_NULL) {
      v->flagsPositive |= RT_NULL;
    }
  }

  declareSymbol(p->name(), v);

  assert(currentInfo);
  if (!effectsOnly)
    currentInfo->parameters.push_back(normalizeParamName(p->name()));
}